

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void finalize(Mat *result,Mat *ocount)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  int y;
  long lVar10;
  long lVar11;
  
  iVar2 = *(int *)(result + 8);
  lVar4 = *(long *)(result + 0x10);
  plVar5 = *(long **)(result + 0x48);
  lVar6 = *(long *)(ocount + 0x10);
  plVar7 = *(long **)(ocount + 0x48);
  iVar3 = *(int *)(result + 0xc);
  for (lVar10 = 0; lVar10 < iVar2; lVar10 = lVar10 + 1) {
    lVar11 = *plVar5 * lVar10 + lVar4;
    lVar8 = *plVar7;
    for (lVar9 = 0; (int)lVar9 < iVar3; lVar9 = lVar9 + 1) {
      fVar1 = *(float *)(lVar8 * lVar10 + lVar6 + lVar9 * 4);
      if (0.0 < fVar1) {
        *(float *)(lVar11 + lVar9 * 4) = *(float *)(lVar11 + lVar9 * 4) / fVar1;
      }
    }
  }
  return;
}

Assistant:

static
void finalize(cv::Mat &result, cv::Mat const &ocount)
{
#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(result.rows, queue,
                 ^(size_t y) {
                   float* p_res = result.ptr<float>(y);
                   float const* p_count = ocount.ptr<float>(y);
                   
                   for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
                     if ( *p_count > 0.0 )
                       *p_res /= *p_count;
                 });
#else
  for (int y = 0; y < result.rows; ++y)
  {
    float* p_res = result.ptr<float>(y);
    float const* p_count = ocount.ptr<float>(y);

    for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
      if ( *p_count > 0.0 )
        *p_res /= *p_count;
  }
#endif
}